

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void wallet::EnsureWalletIsUnlocked(CWallet *wallet)

{
  long lVar1;
  bool bVar2;
  undefined8 uVar3;
  long in_FS_OFFSET;
  CWallet *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CWallet::IsLocked(in_stack_ffffffffffffffa0);
  if (bVar2) {
    uVar3 = __cxa_allocate_exception(0x58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
               in_stack_ffffffffffffffe0,(allocator<char> *)in_stack_ffffffffffffffd8);
    JSONRPCError(in_stack_ffffffffffffffec,in_stack_ffffffffffffffd8);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(uVar3,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void EnsureWalletIsUnlocked(const CWallet& wallet)
{
    if (wallet.IsLocked()) {
        throw JSONRPCError(RPC_WALLET_UNLOCK_NEEDED, "Error: Please enter the wallet passphrase with walletpassphrase first.");
    }
}